

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

string * __thiscall
t_cpp_generator::namespace_close(string *__return_storage_ptr__,t_cpp_generator *this,string *ns)

{
  size_type sVar1;
  long lVar2;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  sVar1 = ns->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"}","");
    lVar2 = std::__cxx11::string::find((char *)ns,0x3a95db,0);
    if (lVar2 != -1) {
      do {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::substr((ulong)local_50,(ulong)ns);
        std::__cxx11::string::operator=((string *)ns,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        lVar2 = std::__cxx11::string::find((char *)ns,0x3a95db,0);
      } while (lVar2 != -1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::namespace_close(string ns) {
  if (ns.size() == 0) {
    return "";
  }
  string result = "}";
  string::size_type loc;
  while ((loc = ns.find(".")) != string::npos) {
    result += "}";
    ns = ns.substr(loc + 1);
  }
  result += " // namespace";
  return result;
}